

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

int __thiscall doctest::Context::run(Context *this)

{
  String *this_00;
  int *piVar1;
  uint *puVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  pointer pvVar6;
  const_iterator __position;
  pointer ppIVar7;
  TestCase *pTVar8;
  vector<doctest::String,_std::allocator<doctest::String>_> *filters;
  char *name;
  char *name_00;
  pointer ppTVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  undefined1 *puVar19;
  _Base_ptr p_Var20;
  size_type sVar21;
  ticks_t tVar22;
  byte bVar23;
  uint uVar24;
  code *__comp;
  IReporter **curr_rep_1;
  long lVar25;
  pointer ppIVar26;
  _Base_ptr name_01;
  ContextState *pCVar27;
  pointer ppTVar28;
  IReporter **curr_rep;
  ulong uVar29;
  _Ios_Openmode _Var30;
  TestCase *name_02;
  long in_FS_OFFSET;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> queryResults
  ;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  testArray;
  ContextState *old_cs;
  anon_class_24_3_e7807fc8 cleanup_and_return;
  anon_union_24_2_13149d16_for_String_2 local_328 [5];
  int local_2a0;
  stack_t sigStack;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilt;
  fstream fstr;
  ostream local_230;
  
  old_cs = detail::g_cs;
  pCVar27 = this->p;
  is_running_in_test = 1;
  detail::g_cs = pCVar27;
  *(bool *)(in_FS_OFFSET + -0xa0) = (pCVar27->super_ContextOptions).no_colors;
  (pCVar27->super_TestRunStats).numAsserts = 0;
  (pCVar27->super_TestRunStats).numAssertsFailed = 0;
  (pCVar27->super_CurrentTestCaseStats).numAssertsCurrentTest = 0;
  (pCVar27->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = 0;
  (pCVar27->super_TestRunStats).numTestCases = 0;
  (pCVar27->super_TestRunStats).numTestCasesPassingFilters = 0;
  (pCVar27->super_TestRunStats).numTestSuitesPassingFilters = 0;
  (pCVar27->super_TestRunStats).numTestCasesFailed = 0;
  std::fstream::fstream(&fstr);
  pCVar27 = this->p;
  if ((pCVar27->super_ContextOptions).cout == (ostream *)0x0) {
    if ((pCVar27->super_ContextOptions).quiet == true) {
      puVar19 = discardOut;
    }
    else {
      bVar23 = (pCVar27->super_ContextOptions).out.field_0.buf[0x17];
      if ((char)bVar23 < '\0') {
        uVar24 = (pCVar27->super_ContextOptions).out.field_0.data.size;
      }
      else {
        uVar24 = 0x17 - (bVar23 & 0x1f);
      }
      if (uVar24 == 0) {
        puVar19 = (undefined1 *)&std::cout;
      }
      else {
        if ((char)bVar23 < '\0') {
          _Var30 = (_Ios_Openmode)*(undefined8 *)&(pCVar27->super_ContextOptions).out.field_0;
        }
        else {
          _Var30 = (int)pCVar27 + (_S_trunc|_S_in);
        }
        std::fstream::open((char *)&fstr,_Var30);
        puVar19 = (undefined1 *)&local_230;
        pCVar27 = this->p;
      }
    }
    (pCVar27->super_ContextOptions).cout = (ostream *)puVar19;
  }
  (anonymous_namespace)::FatalConditionHandler::altStackMem =
       operator_new__((anonymous_namespace)::FatalConditionHandler::altStackSize);
  cleanup_and_return.old_cs = &old_cs;
  pvVar6 = (pCVar27->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cleanup_and_return.fstr = &fstr;
  cleanup_and_return.this = this;
  if (pvVar6[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_start ==
      pvVar6[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    String::String((String *)local_328,"console");
    std::vector<doctest::String,_std::allocator<doctest::String>_>::emplace_back<doctest::String>
              (pvVar6 + 8,(String *)local_328);
    String::~String((String *)local_328);
  }
  anon_unknown_14::getReporters();
  for (p_Var20 = anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
      (_Rb_tree_header *)p_Var20 !=
      &anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header;
      p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
    if (*(char *)((long)&p_Var20[1]._M_right + 7) < '\0') {
      name_01 = p_Var20[1]._M_parent;
    }
    else {
      name_01 = (_Base_ptr)&p_Var20[1]._M_parent;
    }
    pCVar27 = this->p;
    bVar10 = anon_unknown_14::matchesAny
                       ((char *)name_01,
                        (pCVar27->filters).
                        super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 8,false,
                        (pCVar27->super_ContextOptions).case_sensitive);
    if (bVar10) {
      local_328[0]._0_8_ = (**(code **)(p_Var20 + 2))(detail::g_cs);
      std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>::
      emplace_back<doctest::IReporter*>
                ((vector<doctest::IReporter*,std::allocator<doctest::IReporter*>> *)
                 &pCVar27->reporters_currently_used,(IReporter **)local_328);
    }
  }
  anon_unknown_14::getListeners();
  for (p_Var20 = anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left; pCVar27 = this->p,
      (_Rb_tree_header *)p_Var20 !=
      &anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header;
      p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
    __position._M_current =
         (pCVar27->reporters_currently_used).
         super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_328[0]._0_8_ = (**(code **)(p_Var20 + 2))(detail::g_cs);
    std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::_M_insert_rval
              (&pCVar27->reporters_currently_used,__position,(value_type *)local_328);
  }
  if (((((pCVar27->super_ContextOptions).no_run != false) ||
       ((pCVar27->super_ContextOptions).version != false)) ||
      ((pCVar27->super_ContextOptions).help != false)) ||
     ((pCVar27->super_ContextOptions).list_reporters == true)) {
    ppIVar7 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar26 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar26 != ppIVar7;
        ppIVar26 = ppIVar26 + 1) {
      local_328[0].data.ptr = (TestCase *)0x0;
      local_328[0]._8_8_ = (pointer)0x0;
      local_328[0]._16_8_ = 0;
      (**(*ppIVar26)->_vptr_IReporter)(*ppIVar26,local_328);
    }
    iVar17 = run::anon_class_24_3_e7807fc8::operator()(&cleanup_and_return);
    goto LAB_0010a2f5;
  }
  testArray.
  super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testArray.
  super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  testArray.
  super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  detail::getRegisteredTests();
  for (p_Var20 = detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
      ppTVar28 = testArray.
                 super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
      ppTVar9 = testArray.
                super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      (_Rb_tree_header *)p_Var20 !=
      &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header;
      p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
    local_328[0]._0_8_ = p_Var20 + 1;
    std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>::
    emplace_back<doctest::detail::TestCase_const*>
              ((vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
                *)&testArray,(TestCase **)local_328);
  }
  pCVar27 = this->p;
  (pCVar27->super_TestRunStats).numTestCases =
       (uint)((ulong)((long)testArray.
                            super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)testArray.
                           super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (testArray.
      super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      testArray.
      super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &(pCVar27->super_ContextOptions).order_by;
    iVar17 = String::compare(this_00,"file",true);
    if (iVar17 == 0) {
      __comp = anon_unknown_14::fileOrderComparator;
    }
    else {
      iVar17 = String::compare(this_00,"suite",true);
      if (iVar17 == 0) {
        __comp = anon_unknown_14::suiteOrderComparator;
      }
      else {
        iVar17 = String::compare(this_00,"name",true);
        if (iVar17 != 0) {
          iVar17 = String::compare(this_00,"rand",true);
          if (iVar17 == 0) {
            srand((pCVar27->super_ContextOptions).rand_seed);
            ppTVar9 = testArray.
                      super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            for (uVar29 = (long)testArray.
                                super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)testArray.
                                super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3; uVar29 != 1;
                uVar29 = uVar29 - 1) {
              iVar17 = rand();
              pTVar8 = ppTVar9[uVar29 - 1];
              iVar17 = (int)((ulong)(long)iVar17 % uVar29);
              ppTVar9[uVar29 - 1] = ppTVar9[iVar17];
              ppTVar9[iVar17] = pTVar8;
            }
          }
          goto LAB_0010a45c;
        }
        __comp = anon_unknown_14::nameOrderComparator;
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>>
              ((__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                )ppTVar9,
               (__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                )ppTVar28,
               (_Iter_comp_iter<bool_(*)(const_doctest::detail::TestCase_*,_const_doctest::detail::TestCase_*)>
                )__comp);
  }
LAB_0010a45c:
  testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_header;
  testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar27 = this->p;
  ppTVar28 = testArray.
             super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ppTVar9 = testArray.
            super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (((pCVar27->super_ContextOptions).count == false) &&
     ((pCVar27->super_ContextOptions).list_test_cases != true)) {
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar10 = true;
    if ((pCVar27->super_ContextOptions).list_test_suites == false) {
      ppIVar7 = (detail::g_cs->reporters_currently_used).
                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar26 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar26 != ppIVar7;
          ppIVar26 = ppIVar26 + 1) {
        (*(*ppIVar26)->_vptr_IReporter[1])();
      }
      bVar10 = false;
      ppTVar28 = testArray.
                 super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar9 = testArray.
                super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else {
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar10 = true;
  }
  for (; ppTVar28 != ppTVar9; ppTVar28 = ppTVar28 + 1) {
    pTVar8 = *ppTVar28;
    pCVar27 = this->p;
    if ((pTVar8->super_TestCaseData).m_skip == true) {
      bVar23 = (pCVar27->super_ContextOptions).no_skip ^ 1;
    }
    else {
      bVar23 = 0;
    }
    name_02 = pTVar8;
    if ((pTVar8->super_TestCaseData).m_file.field_0.buf[0x17] < '\0') {
      name_02 = (TestCase *)(pTVar8->super_TestCaseData).m_file.field_0.data.ptr;
    }
    filters = (pCVar27->filters).
              super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    bVar16 = (pCVar27->super_ContextOptions).case_sensitive;
    bVar11 = anon_unknown_14::matchesAny((char *)name_02,filters,true,bVar16);
    bVar12 = anon_unknown_14::matchesAny((char *)name_02,filters + 1,false,bVar16);
    name = (pTVar8->super_TestCaseData).m_test_suite;
    bVar13 = anon_unknown_14::matchesAny(name,filters + 2,true,bVar16);
    bVar14 = anon_unknown_14::matchesAny(name,filters + 3,false,bVar16);
    name_00 = (pTVar8->super_TestCaseData).m_name;
    bVar15 = anon_unknown_14::matchesAny(name_00,filters + 4,true,bVar16);
    bVar16 = anon_unknown_14::matchesAny(name_00,filters + 5,false,bVar16);
    uVar24 = (pCVar27->super_TestRunStats).numTestCasesPassingFilters;
    if ((!bVar16 && (bVar23 & 1) == 0) && ((bVar15 && (!bVar14 && !bVar12)) && (bVar13 && bVar11)))
    {
      uVar24 = uVar24 + 1;
      (pCVar27->super_TestRunStats).numTestCasesPassingFilters = uVar24;
    }
    uVar4 = (pCVar27->super_ContextOptions).first;
    uVar5 = (pCVar27->super_ContextOptions).last;
    if ((uVar4 <= uVar24 && (uVar5 < uVar4 || uVar24 <= uVar5)) &&
        ((!bVar16 && (bVar23 & 1) == 0) && ((bVar15 && (!bVar14 && !bVar12)) && (bVar13 && bVar11)))
       ) {
      if ((pCVar27->super_ContextOptions).count == false) {
        if ((pCVar27->super_ContextOptions).list_test_cases == true) {
          local_328[0]._0_8_ = pTVar8;
          std::vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>::
          emplace_back<doctest::TestCaseData_const*>
                    ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                      *)&queryResults,(TestCaseData **)local_328);
        }
        else if ((pCVar27->super_ContextOptions).list_test_suites == true) {
          String::String((String *)local_328,name);
          sVar21 = std::
                   set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                   ::count(&testSuitesPassingFilt,(key_type *)local_328);
          if (sVar21 == 0) {
            cVar3 = *(pTVar8->super_TestCaseData).m_test_suite;
            String::~String((String *)local_328);
            if (cVar3 != '\0') {
              local_328[0]._0_8_ = pTVar8;
              std::vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
              ::emplace_back<doctest::TestCaseData_const*>
                        ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                          *)&queryResults,(TestCaseData **)local_328);
              String::String((String *)local_328,(pTVar8->super_TestCaseData).m_test_suite);
              std::
              _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
              ::_M_insert_unique<doctest::String>(&testSuitesPassingFilt._M_t,(String *)local_328);
              String::~String((String *)local_328);
              puVar2 = &(this->p->super_TestRunStats).numTestSuitesPassingFilters;
              *puVar2 = *puVar2 + 1;
            }
          }
          else {
            String::~String((String *)local_328);
          }
        }
        else {
          (pCVar27->super_ContextOptions).currentTest = pTVar8;
          (pCVar27->super_CurrentTestCaseStats).failure_flags = 0;
          (pCVar27->super_CurrentTestCaseStats).seconds = 0.0;
          detail::MultiLaneAtomic<int>::operator=(&pCVar27->numAssertsFailedCurrentTest_atomic,0);
          detail::MultiLaneAtomic<int>::operator=(&this->p->numAssertsCurrentTest_atomic,0);
          std::
          _Rb_tree<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::_Identity<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
          ::clear(&(this->p->subcasesPassed)._M_t);
          ppIVar7 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppIVar26 = (detail::g_cs->reporters_currently_used).
                          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppIVar26 != ppIVar7;
              ppIVar26 = ppIVar26 + 1) {
            (*(*ppIVar26)->_vptr_IReporter[3])(*ppIVar26,pTVar8);
          }
          pCVar27 = this->p;
          tVar22 = detail::getCurrentTicks();
          (pCVar27->timer).m_ticks = tVar22;
          pCVar27 = this->p;
          bVar16 = true;
          do {
            pCVar27->should_reenter = false;
            pCVar27->subcasesCurrentMaxLevel = 0;
            std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
            clear(&pCVar27->subcasesStack);
            LOCK();
            (this->p->shouldLogCurrentException)._M_base._M_i = true;
            UNLOCK();
            std::vector<doctest::String,_std::allocator<doctest::String>_>::clear
                      (&this->p->stringifiedContexts);
            (anonymous_namespace)::FatalConditionHandler::isSet = 1;
            sigStack.ss_sp = (anonymous_namespace)::FatalConditionHandler::altStackMem;
            sigStack.ss_size = (anonymous_namespace)::FatalConditionHandler::altStackSize;
            sigStack.ss_flags = 0;
            sigaltstack((sigaltstack *)&sigStack,
                        (sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack);
            memset((void *)((long)local_328 + 8),0,0x90);
            local_328[0].data.ptr = anon_unknown_14::FatalConditionHandler::handleSignal;
            local_2a0 = 0x8000000;
            puVar19 = (anonymous_namespace)::FatalConditionHandler::oldSigActions;
            for (lVar25 = 0; lVar25 != 0x60; lVar25 = lVar25 + 0x10) {
              sigaction(*(int *)((long)&(anonymous_namespace)::signalDefs + lVar25),
                        (sigaction *)local_328,(sigaction *)puVar19);
              puVar19 = (undefined1 *)((long)puVar19 + 0x98);
            }
            (*pTVar8->m_test)();
            anon_unknown_14::FatalConditionHandler::reset();
            anon_unknown_14::FatalConditionHandler::reset();
            pCVar27 = this->p;
            if (0 < (pCVar27->super_ContextOptions).abort_after) {
              iVar17 = (pCVar27->super_TestRunStats).numAssertsFailed;
              iVar18 = detail::MultiLaneAtomic::operator_cast_to_int
                                 (&pCVar27->numAssertsFailedCurrentTest_atomic);
              pCVar27 = this->p;
              if ((pCVar27->super_ContextOptions).abort_after <= iVar18 + iVar17) {
                piVar1 = &(pCVar27->super_CurrentTestCaseStats).failure_flags;
                *(byte *)piVar1 = (byte)*piVar1 | 8;
                bVar16 = false;
              }
            }
            if (pCVar27->should_reenter != true) break;
            if (bVar16) {
              ppIVar7 = (detail::g_cs->reporters_currently_used).
                        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (ppIVar26 = (detail::g_cs->reporters_currently_used).
                              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppIVar26 != ppIVar7;
                  ppIVar26 = ppIVar26 + 1) {
                (*(*ppIVar26)->_vptr_IReporter[4])(*ppIVar26,pTVar8);
              }
              pCVar27 = this->p;
              if ((pCVar27->should_reenter & 1U) == 0) break;
            }
          } while (bVar16);
          detail::ContextState::finalizeTestCaseData(pCVar27);
          ppIVar7 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppIVar26 = (detail::g_cs->reporters_currently_used).
                          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppIVar26 != ppIVar7;
              ppIVar26 = ppIVar26 + 1) {
            (*(*ppIVar26)->_vptr_IReporter[5])(*ppIVar26,&detail::g_cs->super_CurrentTestCaseStats);
          }
          pCVar27 = this->p;
          (pCVar27->super_ContextOptions).currentTest = (TestCase *)0x0;
          iVar17 = (pCVar27->super_ContextOptions).abort_after;
          if ((0 < iVar17) && (iVar17 <= (pCVar27->super_TestRunStats).numAssertsFailed)) break;
        }
      }
    }
    else if (!bVar10) {
      ppIVar7 = (detail::g_cs->reporters_currently_used).
                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar26 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar26 != ppIVar7;
          ppIVar26 = ppIVar26 + 1) {
        (*(*ppIVar26)->_vptr_IReporter[0xb])(*ppIVar26,pTVar8);
      }
    }
  }
  if (bVar10) {
    local_328[0]._0_8_ = &detail::g_cs->super_TestRunStats;
    if (detail::g_cs == (ContextState *)0x0) {
      local_328[0]._0_8_ = (TestCase *)0x0;
    }
    local_328[0]._8_8_ =
         queryResults.
         super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_328[0]._16_4_ =
         (int)((ulong)((long)queryResults.
                             super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)queryResults.
                            super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
    ppIVar7 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar26 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar26 != ppIVar7;
        ppIVar26 = ppIVar26 + 1) {
      (**(*ppIVar26)->_vptr_IReporter)(*ppIVar26,local_328);
    }
  }
  else {
    ppIVar7 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar26 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar26 != ppIVar7;
        ppIVar26 = ppIVar26 + 1) {
      (*(*ppIVar26)->_vptr_IReporter[2])(*ppIVar26,&detail::g_cs->super_TestRunStats);
    }
  }
  iVar17 = run::anon_class_24_3_e7807fc8::operator()(&cleanup_and_return);
  std::_Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>::
  ~_Vector_base(&queryResults.
                 super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
               );
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree(&testSuitesPassingFilt._M_t);
  std::
  _Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  ::~_Vector_base(&testArray.
                   super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                 );
LAB_0010a2f5:
  std::fstream::~fstream(&fstr);
  return iVar17;
}

Assistant:

int Context::run() {
    using namespace detail;

    // save the old context state in case such was setup - for using asserts out of a testing context
    auto old_cs = g_cs;
    // this is the current contest
    g_cs               = p;
    is_running_in_test = true;

    g_no_colors = p->no_colors;
    p->resetRunData();

    std::fstream fstr;
    if(p->cout == nullptr) {
        if(p->quiet) {
            p->cout = &discardOut;
        } else if(p->out.size()) {
            // to a file if specified
            fstr.open(p->out.c_str(), std::fstream::out);
            p->cout = &fstr;
        } else {
            // stdout by default
            p->cout = &std::cout;
        }
    }

    FatalConditionHandler::allocateAltStackMem();

    auto cleanup_and_return = [&]() {
        FatalConditionHandler::freeAltStackMem();

        if(fstr.is_open())
            fstr.close();

        // restore context
        g_cs               = old_cs;
        is_running_in_test = false;

        // we have to free the reporters which were allocated when the run started
        for(auto& curr : p->reporters_currently_used)
            delete curr;
        p->reporters_currently_used.clear();

        if(p->numTestCasesFailed && !p->no_exitcode)
            return EXIT_FAILURE;
        return EXIT_SUCCESS;
    };

    // setup default reporter if none is given through the command line
    if(p->filters[8].empty())
        p->filters[8].push_back("console");

    // check to see if any of the registered reporters has been selected
    for(auto& curr : getReporters()) {
        if(matchesAny(curr.first.second.c_str(), p->filters[8], false, p->case_sensitive))
            p->reporters_currently_used.push_back(curr.second(*g_cs));
    }

    // TODO: check if there is nothing in reporters_currently_used

    // prepend all listeners
    for(auto& curr : getListeners())
        p->reporters_currently_used.insert(p->reporters_currently_used.begin(), curr.second(*g_cs));

#ifdef DOCTEST_PLATFORM_WINDOWS
    if(isDebuggerActive() && p->no_debug_output == false)
        p->reporters_currently_used.push_back(new DebugOutputWindowReporter(*g_cs));
#endif // DOCTEST_PLATFORM_WINDOWS

    // handle version, help and no_run
    if(p->no_run || p->version || p->help || p->list_reporters) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, QueryData());

        return cleanup_and_return();
    }

    std::vector<const TestCase*> testArray;
    for(auto& curr : getRegisteredTests())
        testArray.push_back(&curr);
    p->numTestCases = testArray.size();

    // sort the collected records
    if(!testArray.empty()) {
        if(p->order_by.compare("file", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            std::srand(p->rand_seed);

            // random_shuffle implementation
            const auto first = &testArray[0];
            for(size_t i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = std::rand() % (i + 1); // NOLINT

                const auto temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        } else if(p->order_by.compare("none", true) == 0) {
            // means no sorting - beneficial for death tests which call into the executable
            // with a specific test case in mind - we don't want to slow down the startup times
        }
    }

    std::set<String> testSuitesPassingFilt;

    bool                             query_mode = p->count || p->list_test_cases || p->list_test_suites;
    std::vector<const TestCaseData*> queryResults;

    if(!query_mode)
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_start, DOCTEST_EMPTY);

    // invoke the registered functions if they match the filter criteria (or just count them)
    for(auto& curr : testArray) {
        const auto& tc = *curr;

        bool skip_me = false;
        if(tc.m_skip && !p->no_skip)
            skip_me = true;

        if(!matchesAny(tc.m_file.c_str(), p->filters[0], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_file.c_str(), p->filters[1], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_test_suite, p->filters[2], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_test_suite, p->filters[3], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_name, p->filters[4], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_name, p->filters[5], false, p->case_sensitive))
            skip_me = true;

        if(!skip_me)
            p->numTestCasesPassingFilters++;

        // skip the test if it is not in the execution range
        if((p->last < p->numTestCasesPassingFilters && p->first <= p->last) ||
           (p->first > p->numTestCasesPassingFilters))
            skip_me = true;

        if(skip_me) {
            if(!query_mode)
                DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_skipped, tc);
            continue;
        }

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            queryResults.push_back(&tc);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if((testSuitesPassingFilt.count(tc.m_test_suite) == 0) && tc.m_test_suite[0] != '\0') {
                queryResults.push_back(&tc);
                testSuitesPassingFilt.insert(tc.m_test_suite);
                p->numTestSuitesPassingFilters++;
            }
            continue;
        }

        // execute the test if it passes all the filtering
        {
            p->currentTest = &tc;

            p->failure_flags = TestCaseFailureReason::None;
            p->seconds       = 0;

            // reset atomic counters
            p->numAssertsFailedCurrentTest_atomic = 0;
            p->numAssertsCurrentTest_atomic       = 0;

            p->subcasesPassed.clear();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_start, tc);

            p->timer.start();

            bool run_test = true;

            do {
                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->should_reenter          = false;
                p->subcasesCurrentMaxLevel = 0;
                p->subcasesStack.clear();

                p->shouldLogCurrentException = true;

                // reset stuff for logging with INFO()
                p->stringifiedContexts.clear();

#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
// MSVC 2015 diagnoses fatalConditionHandler as unused (because reset() is a static method)
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4101) // unreferenced local variable
                    FatalConditionHandler fatalConditionHandler; // Handle signals
                    // execute the test
                    tc.m_test();
                    fatalConditionHandler.reset();
DOCTEST_MSVC_SUPPRESS_WARNING_POP
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                } catch(const TestFailureException&) {
                    p->failure_flags |= TestCaseFailureReason::AssertFailure;
                } catch(...) {
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception,
                                                      {translateActiveException(), false});
                    p->failure_flags |= TestCaseFailureReason::Exception;
                }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS

                // exit this loop if enough assertions have failed - even if there are more subcases
                if(p->abort_after > 0 &&
                   p->numAssertsFailed + p->numAssertsFailedCurrentTest_atomic >= p->abort_after) {
                    run_test = false;
                    p->failure_flags |= TestCaseFailureReason::TooManyFailedAsserts;
                }

                if(p->should_reenter && run_test)
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_reenter, tc);
                if(!p->should_reenter)
                    run_test = false;
            } while(run_test);

            p->finalizeTestCaseData();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

            p->currentTest = nullptr;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numAssertsFailed >= p->abort_after)
                break;
        }
    }

    if(!query_mode) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    } else {
        QueryData qdata;
        qdata.run_stats = g_cs;
        qdata.data      = queryResults.data();
        qdata.num_data  = unsigned(queryResults.size());
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, qdata);
    }

    return cleanup_and_return();
}